

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

QRectF * __thiscall QGraphicsScene::sceneRect(QRectF *__return_storage_ptr__,QGraphicsScene *this)

{
  QRectF *this_00;
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  bool bVar5;
  QGraphicsScenePrivate *thatd;
  long in_FS_OFFSET;
  QRectF QStack_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(uint *)(lVar1 + 0xb8) & 1) == 0) {
    if ((*(uint *)(lVar1 + 0xb8) & 2) != 0) {
      this_00 = (QRectF *)(lVar1 + 200);
      local_58.xp = *(qreal *)(lVar1 + 200);
      local_58.yp = *(qreal *)(lVar1 + 0xd0);
      local_58.w = *(qreal *)(lVar1 + 0xd8);
      local_58.h = *(qreal *)(lVar1 + 0xe0);
      itemsBoundingRect(&QStack_78,this);
      QRectF::operator|=(this_00,&QStack_78);
      *(byte *)(lVar1 + 0xb8) = *(byte *)(lVar1 + 0xb8) & 0xfd;
      bVar5 = ::operator!=(&local_58,this_00);
      if (bVar5) {
        sceneRectChanged(this,this_00);
      }
    }
    qVar2 = *(qreal *)(lVar1 + 200);
    qVar3 = *(qreal *)(lVar1 + 0xd0);
    qVar4 = *(qreal *)(lVar1 + 0xe0);
    __return_storage_ptr__->w = *(qreal *)(lVar1 + 0xd8);
    __return_storage_ptr__->h = qVar4;
    __return_storage_ptr__->xp = qVar2;
    __return_storage_ptr__->yp = qVar3;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    qVar2 = *(qreal *)(lVar1 + 0x98);
    qVar3 = *(qreal *)(lVar1 + 0xa0);
    qVar4 = *(qreal *)(lVar1 + 0xb0);
    __return_storage_ptr__->w = *(qreal *)(lVar1 + 0xa8);
    __return_storage_ptr__->h = qVar4;
    __return_storage_ptr__->xp = qVar2;
    __return_storage_ptr__->yp = qVar3;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsScene::sceneRect() const
{
    Q_D(const QGraphicsScene);
    if (d->hasSceneRect)
        return d->sceneRect;

    if (d->dirtyGrowingItemsBoundingRect) {
        // Lazily update the growing items bounding rect
        QGraphicsScenePrivate *thatd = const_cast<QGraphicsScenePrivate *>(d);
        QRectF oldGrowingBoundingRect = thatd->growingItemsBoundingRect;
        thatd->growingItemsBoundingRect |= itemsBoundingRect();
        thatd->dirtyGrowingItemsBoundingRect = false;
        if (oldGrowingBoundingRect != thatd->growingItemsBoundingRect)
            emit const_cast<QGraphicsScene *>(this)->sceneRectChanged(thatd->growingItemsBoundingRect);
    }
    return d->growingItemsBoundingRect;
}